

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O3

int __thiscall OPLmusicFile::PlayTick(OPLmusicFile *this)

{
  ushort *puVar1;
  uint *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  OPLio *pOVar8;
  uint *puVar9;
  ushort *puVar10;
  byte *pbVar11;
  ulong uVar12;
  byte *pbVar13;
  BYTE *pBVar14;
  long lVar15;
  BYTE *pBVar16;
  uint uVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  
  switch(this->RawPlayer) {
  case RDosPlay:
    do {
      puVar10 = (ushort *)(this->super_OPLmusicBlock).super_musicBlock.score;
      while( true ) {
        while( true ) {
          while( true ) {
            if ((this->super_OPLmusicBlock).super_musicBlock.scoredata + this->ScoreLen <= puVar10)
            {
              return 0;
            }
            (this->super_OPLmusicBlock).super_musicBlock.score = (byte *)((long)puVar10 + 1);
            bVar3 = (byte)*puVar10;
            puVar1 = puVar10 + 1;
            (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)puVar1;
            bVar4 = *(byte *)((long)puVar10 + 1);
            puVar10 = puVar1;
            if (bVar4 != 0xff) break;
            if (bVar3 == 0xff) {
              return 0;
            }
          }
          if (bVar4 != 2) break;
          if (bVar3 == 2) {
            this->WhichChip = 1;
          }
          else if (bVar3 == 1) {
            this->WhichChip = 0;
          }
          else if (bVar3 == 0) {
            (this->super_OPLmusicBlock).SamplesPerTick = (double)*puVar1 * 0.041666666666666664;
            (*((this->super_OPLmusicBlock).super_musicBlock.io)->_vptr_OPLio[5])();
            puVar10 = (ushort *)((this->super_OPLmusicBlock).super_musicBlock.score + 2);
            (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)puVar10;
          }
        }
        if (bVar4 != 0) break;
        if (bVar3 != 0) {
          return (uint)bVar3;
        }
      }
      pOVar8 = (this->super_OPLmusicBlock).super_musicBlock.io;
      (*pOVar8->_vptr_OPLio[4])(pOVar8,(ulong)(uint)this->WhichChip,(ulong)bVar4,(ulong)bVar3);
    } while( true );
  case IMF:
    while( true ) {
      puVar9 = (uint *)(this->super_OPLmusicBlock).super_musicBlock.score;
      puVar2 = puVar9 + 1;
      if ((long)this->ScoreLen <
          (long)puVar2 - (long)(this->super_OPLmusicBlock).super_musicBlock.scoredata) {
        return 0;
      }
      uVar17 = *puVar9;
      if (uVar17 == 0xffffffff) break;
      (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)puVar2;
      pOVar8 = (this->super_OPLmusicBlock).super_musicBlock.io;
      (*pOVar8->_vptr_OPLio[4])(pOVar8,0,(ulong)(uVar17 & 0xff),(ulong)(uVar17 >> 8 & 0xff));
      if (0xffff < uVar17) {
        return uVar17 >> 0x10;
      }
    }
    return 0;
  case DosBox1:
    pbVar11 = (this->super_OPLmusicBlock).super_musicBlock.score;
    pBVar16 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
    uVar12 = (ulong)this->ScoreLen;
    if (pbVar11 < pBVar16 + uVar12) {
      do {
        pbVar13 = pbVar11 + 1;
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar13;
        uVar20 = (ulong)*pbVar11;
        switch(uVar20) {
        case 0:
          (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11 + 2;
          uVar17 = (uint)pbVar11[1];
LAB_00336dcc:
          return uVar17 + 1;
        case 1:
          uVar7 = *(ushort *)(pbVar11 + 1);
          (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11 + 3;
          return uVar7 + 1;
        case 2:
          this->WhichChip = 0;
          pbVar11 = pbVar13;
          break;
        case 3:
          this->WhichChip = 1;
          pbVar11 = pbVar13;
          break;
        case 4:
          pbVar13 = pbVar11 + 2;
          (this->super_OPLmusicBlock).super_musicBlock.score = pbVar13;
          uVar20 = (ulong)pbVar11[1];
          lVar15 = 3;
          goto LAB_00336c6c;
        default:
          lVar15 = 2;
LAB_00336c6c:
          (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11 + lVar15;
          pOVar8 = (this->super_OPLmusicBlock).super_musicBlock.io;
          (*pOVar8->_vptr_OPLio[4])(pOVar8,(ulong)(uint)this->WhichChip,uVar20,(ulong)*pbVar13);
          pBVar16 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
          uVar12 = (ulong)(uint)this->ScoreLen;
          pbVar11 = (this->super_OPLmusicBlock).super_musicBlock.score;
        }
      } while (pbVar11 < pBVar16 + (int)uVar12);
    }
    break;
  case DosBox2:
    pbVar11 = (this->super_OPLmusicBlock).super_musicBlock.score;
    pBVar16 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
    uVar12 = (ulong)this->ScoreLen;
    if (pbVar11 < pBVar16 + uVar12) {
      bVar3 = pBVar16[0x19];
      bVar4 = pBVar16[0x17];
      bVar5 = pBVar16[0x18];
      pBVar14 = pBVar16;
      do {
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11 + 1;
        bVar6 = *pbVar11;
        pbVar13 = pbVar11 + 2;
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar13;
        uVar17 = (uint)pbVar11[1];
        uVar19 = bVar6 & 0x7f;
        bVar18 = (byte)uVar19;
        if (bVar18 == bVar4) goto LAB_00336dcc;
        if (bVar18 == bVar5) {
          return uVar17 * 0x100 + 0x100;
        }
        if (bVar18 < bVar3) {
          pOVar8 = (this->super_OPLmusicBlock).super_musicBlock.io;
          (*pOVar8->_vptr_OPLio[4])
                    (pOVar8,(ulong)(bVar6 >> 7),(ulong)pBVar16[(ulong)uVar19 + 0x1a],
                     (ulong)pbVar11[1]);
          pbVar13 = (this->super_OPLmusicBlock).super_musicBlock.score;
          pBVar14 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
          uVar12 = (ulong)(uint)this->ScoreLen;
        }
        pbVar11 = pbVar13;
      } while (pbVar13 < pBVar14 + (int)uVar12);
    }
  }
  return 0;
}

Assistant:

int OPLmusicFile::PlayTick ()
{
	BYTE reg, data;
	WORD delay;

	switch (RawPlayer)
	{
	case RDosPlay:
		while (score < scoredata + ScoreLen)
		{
			data = *score++;
			reg = *score++;
			switch (reg)
			{
			case 0:		// Delay
				if (data != 0)
				{
					return data;
				}
				break;

			case 2:		// Speed change or OPL3 switch
				if (data == 0)
				{
					SamplesPerTick = LittleShort(*(WORD *)(score)) / ADLIB_CLOCK_MUL;
					io->SetClockRate(SamplesPerTick);
					score += 2;
				}
				else if (data == 1)
				{
					WhichChip = 0;
				}
				else if (data == 2)
				{
					WhichChip = 1;
				}
				break;

			case 0xFF:	// End of song
				if (data == 0xFF)
				{
					return 0;
				}
				break;

			default:	// It's something to stuff into the OPL chip
				io->OPLwriteReg(WhichChip, reg, data);
				break;
			}
		}
		break;

	case DosBox1:
		while (score < scoredata + ScoreLen)
		{
			reg = *score++;

			if (reg == 4)
			{
				reg = *score++;
				data = *score++;
			}
			else if (reg == 0)
			{ // One-byte delay
				return *score++ + 1;
			}
			else if (reg == 1)
			{ // Two-byte delay
				int delay = score[0] + (score[1] << 8) + 1;
				score += 2;
				return delay;
			}
			else if (reg == 2)
			{ // Select OPL chip 0
				WhichChip = 0;
				continue;
			}
			else if (reg == 3)
			{ // Select OPL chip 1
				WhichChip = 1;
				continue;
			}
			else
			{
				data = *score++;
			}
			io->OPLwriteReg(WhichChip, reg, data);
		}
		break;

	case DosBox2:
		{
			BYTE *to_reg = scoredata + 0x1A;
			BYTE to_reg_size = scoredata[0x19];
			BYTE short_delay_code = scoredata[0x17];
			BYTE long_delay_code = scoredata[0x18];

			while (score < scoredata + ScoreLen)
			{
				BYTE code = *score++;
				data = *score++;

				// Which OPL chip to write to is encoded in the high bit of the code value.
				int which = !!(code & 0x80);
				code &= 0x7F;

				if (code == short_delay_code)
				{
					return data + 1;
				}
				else if (code == long_delay_code)
				{
					return (data + 1) << 8;
				}
				else if (code < to_reg_size)
				{
					io->OPLwriteReg(which, to_reg[code], data);
				}
			}
		}
		break;

	case IMF:
		delay = 0;
		while (delay == 0 && score + 4 - scoredata <= ScoreLen)
		{
			if (*(DWORD *)score == 0xFFFFFFFF)
			{ // This is a special value that means to end the song.
				return 0;
			}
			reg = score[0];
			data = score[1];
			delay = LittleShort(((WORD *)score)[1]);
			score += 4;
			io->OPLwriteReg (0, reg, data);
		}
		return delay;
	}
	return 0;
}